

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_life_tokens.hpp
# Opt level: O0

void __thiscall
wigwag::life_assurance::intrusive_life_tokens::execution_guard::execution_guard
          (execution_guard *this,life_checker *c)

{
  __int_type_conflict _Var1;
  life_assurance *plVar2;
  life_checker *c_local;
  execution_guard *this_local;
  
  this->_sd = c->_sd;
  plVar2 = wigwag::detail::
           intrusive_ptr<const_wigwag::life_assurance::intrusive_life_tokens::life_assurance>::get
                     (&c->_la);
  this->_la = plVar2;
  plVar2 = wigwag::detail::
           intrusive_ptr<const_wigwag::life_assurance::intrusive_life_tokens::life_assurance>::
           operator->(&c->_la);
  _Var1 = std::__atomic_base<unsigned_int>::operator++
                    (&(plVar2->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>);
  this->_alive = _Var1 & 0x80000000;
  if (this->_alive == 0) {
    unlock(this);
  }
  return;
}

Assistant:

execution_guard(const life_checker& c)
                : _sd(*c._sd), _la(c._la.get()), _alive(++c._la->_lock_counter_and_alive_flag & life_assurance::alive_flag)
            {
                if (!_alive)
                    unlock();
            }